

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_2,_5>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float afVar1 [2];
  float *pfVar2;
  Vector<float,_2> *pVVar3;
  long lVar4;
  undefined4 *puVar5;
  long lVar6;
  bool bVar7;
  float v;
  float fVar8;
  undefined4 uVar9;
  Vector<float,_2> res;
  Type in0;
  float local_34 [3];
  Type in1;
  Vec4 *local_18;
  int local_10 [4];
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    afVar1 = *(float (*) [2])(evalCtx->coords).m_data;
  }
  else {
    afVar1[0] = 1.2;
    afVar1[1] = 0.5;
  }
  in0.m_data[0] = afVar1[0];
  in0.m_data[1] = afVar1[1];
  pfVar2 = (float *)&in1;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    do {
      lVar6 = 0;
      do {
        uVar9 = 0x3f800000;
        if (lVar4 != lVar6) {
          uVar9 = 0;
        }
        pfVar2[lVar6 * 2] = (float)uVar9;
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      pfVar2 = pfVar2 + 1;
      bVar7 = lVar4 == 0;
      lVar4 = lVar4 + 1;
    } while (bVar7);
    in1.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    in1.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
  }
  else {
    in1.m_data.m_data[0].m_data[0] = 0.0;
    in1.m_data.m_data[0].m_data[1] = 0.0;
    in1.m_data.m_data[1].m_data[0] = 0.0;
    in1.m_data.m_data[1].m_data[1] = 0.0;
    puVar5 = &DAT_01c2e0b0;
    lVar4 = 0;
    do {
      lVar6 = 0;
      do {
        pfVar2[lVar6 * 2] = (float)puVar5[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      pfVar2 = pfVar2 + 1;
      puVar5 = puVar5 + 2;
      bVar7 = lVar4 == 0;
      lVar4 = lVar4 + 1;
    } while (bVar7);
  }
  pVVar3 = (Vector<float,_2> *)&in1;
  lVar4 = 0;
  do {
    fVar8 = 0.0;
    lVar6 = 0;
    do {
      fVar8 = fVar8 + ((Vector<tcu::Vector<float,_2>,_2> *)pVVar3->m_data)->m_data[0].m_data[lVar6]
                      * in0.m_data[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    res.m_data[lVar4] = fVar8;
    pVVar3 = pVVar3 + 1;
    bVar7 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar7);
  local_18 = &evalCtx->color;
  local_10[0] = 0;
  local_10[1] = 1;
  local_10[2] = 2;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_18 + lVar4 * 4)] = in0.m_data[lVar4 + 1];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}